

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_world.cc
# Opt level: O0

void sptk::world::anon_unknown_6::BackwardFFT(fft_plan p)

{
  int unaff_retaddr;
  int unaff_retaddr_00;
  int in_stack_00000008;
  int i_3;
  int i_2;
  int i_1;
  int i;
  long in_stack_00000028;
  double *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  double *a;
  int in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  undefined4 in_stack_fffffffffffffff8;
  int iVar1;
  
  a = (double *)&stack0x00000008;
  if (in_stack_00000028 == 0) {
    *(undefined8 *)p._8_8_ = *_i_3;
    *(undefined8 *)(p._8_8_ + 8) = _i_3[(long)(in_stack_00000008 / 2) * 2];
    for (iVar1 = 1; iVar1 < in_stack_00000008 / 2; iVar1 = iVar1 + 1) {
      *(undefined8 *)(p._8_8_ + (long)(iVar1 << 1) * 8) = _i_3[(long)iVar1 * 2];
      *(ulong *)(p._8_8_ + (long)(iVar1 * 2 + 1) * 8) =
           _i_3[(long)iVar1 * 2 + 1] ^ 0x8000000000000000;
    }
    rdft(unaff_retaddr_00,unaff_retaddr,(double *)CONCAT44(iVar1,in_stack_fffffffffffffff8),
         (int *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),a);
    for (iVar1 = 0; iVar1 < *(int *)a; iVar1 = iVar1 + 1) {
      *(double *)((long)a[5] + (long)iVar1 * 8) = *(double *)((long)a[6] + (long)iVar1 * 8) * 2.0;
    }
  }
  else {
    for (iVar1 = 0; iVar1 < in_stack_00000008; iVar1 = iVar1 + 1) {
      *(undefined8 *)(p._8_8_ + (long)(iVar1 << 1) * 8) = _i_3[(long)iVar1 * 2];
      *(undefined8 *)(p._8_8_ + (long)(iVar1 * 2 + 1) * 8) = _i_3[(long)iVar1 * 2 + 1];
    }
    cdft(iVar1,in_stack_fffffffffffffff0,a,
         (int *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
         in_stack_ffffffffffffffd8);
    for (iVar1 = 0; iVar1 < *(int *)a; iVar1 = iVar1 + 1) {
      *(undefined8 *)((long)a[4] + (long)iVar1 * 0x10) =
           *(undefined8 *)((long)a[6] + (long)(iVar1 << 1) * 8);
      *(ulong *)((long)a[4] + (long)iVar1 * 0x10 + 8) =
           *(ulong *)((long)a[6] + (long)(iVar1 * 2 + 1) * 8) ^ 0x8000000000000000;
    }
  }
  return;
}

Assistant:

static void BackwardFFT(fft_plan p) {
  if (p.c_out == NULL) {  // c2r
    p.input[0] = p.c_in[0][0];
    p.input[1] = p.c_in[p.n / 2][0];
    for (int i = 1; i < p.n / 2; ++i) {
      p.input[i * 2]  = p.c_in[i][0];
      p.input[i * 2 + 1]  = -p.c_in[i][1];
    }
    rdft(p.n, -1, p.input, p.ip, p.w);
    for (int i = 0; i < p.n; ++i) p.out[i] = p.input[i] * 2.0;
  } else {  // c2c
    for (int i = 0; i < p.n; ++i) {
      p.input[i * 2] = p.c_in[i][0];
      p.input[i * 2 + 1] = p.c_in[i][1];
    }
    cdft(p.n * 2, -1, p.input, p.ip, p.w);
    for (int i = 0; i < p.n; ++i) {
      p.c_out[i][0] = p.input[i * 2];
      p.c_out[i][1] = -p.input[i * 2 + 1];
    }
  }
}